

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O1

void __thiscall
Encoder::ValidateCRCOnFinalBuffer
          (Encoder *this,BYTE *finalCodeBufferStart,size_t finalCodeSize,size_t jumpTableSize,
          BYTE *oldCodeBufferStart,uint initialCrcSeed,uint bufferCrcToValidate,
          BOOL isSuccessBrShortAndLoopAlign)

{
  List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Type *reloc;
  BYTE *pBVar5;
  long lVar6;
  EncoderMD *this_01;
  int index;
  BYTE *pBVar7;
  int iVar8;
  BYTE *local_40;
  uint local_34 [2];
  uint finalBufferCRC;
  
  this_00 = (this->m_encoderMD).m_relocList;
  this_01 = &this->m_encoderMD;
  lVar6 = finalCodeSize - jumpTableSize;
  local_40 = finalCodeBufferStart;
  local_34[0] = initialCrcSeed;
  if ((this_00 !=
       (List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) &&
     (0 < (this_00->
          super_ReadOnlyList<EncodeRelocAndLabels,_Memory::ArenaAllocator,_DefaultComparer>).count))
  {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    index = 0;
    pBVar7 = (BYTE *)0x0;
    do {
      reloc = JsUtil::
              List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_00,index);
      pBVar5 = EncoderMD::GetRelocBufferAddress(this_01,reloc);
      if ((oldCodeBufferStart <= pBVar5) &&
         (pBVar5 = EncoderMD::GetRelocBufferAddress(this_01,reloc),
         pBVar5 < oldCodeBufferStart + lVar6)) {
        pBVar5 = EncoderMD::GetRelocBufferAddress(this_01,reloc);
        pBVar5 = finalCodeBufferStart + ((long)pBVar5 - (long)oldCodeBufferStart);
        if (pBVar5 < finalCodeBufferStart || finalCodeBufferStart + lVar6 <= pBVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                             ,0x42b,
                             "(finalBufferRelocTuplePtr >= finalCodeBufferStart && finalBufferRelocTuplePtr < (finalCodeBufferStart + finalCodeSizeWithoutJumpTable))"
                             ,
                             "finalBufferRelocTuplePtr >= finalCodeBufferStart && finalBufferRelocTuplePtr < (finalCodeBufferStart + finalCodeSizeWithoutJumpTable)"
                            );
          if (!bVar2) goto LAB_0040feea;
          *puVar4 = 0;
        }
        uVar3 = EncoderMD::GetRelocDataSize(this_01,reloc);
        if (uVar3 != 0) {
          if (pBVar5 <= pBVar7 && pBVar7 != (BYTE *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                               ,0x42f,"(oldPtr == nullptr || oldPtr < finalBufferRelocTuplePtr)",
                               "Assumption here is that the reloc list is strictly increasing in terms of bufferAddress"
                              );
            if (!bVar2) goto LAB_0040feea;
            *puVar4 = 0;
          }
          if (pBVar5 < local_40) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                               ,0x435,"(currentEndAddress >= currentStartAddress)",
                               "currentEndAddress >= currentStartAddress");
            if (!bVar2) goto LAB_0040feea;
            *puVar4 = 0;
          }
          local_34[0] = CalculateCRC(local_34[0],(long)pBVar5 - (long)local_40,local_40);
          iVar8 = uVar3 + (uVar3 == 0);
          do {
            local_34[0] = CalculateCRC(local_34[0],0);
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
          local_40 = pBVar5 + uVar3;
          pBVar7 = pBVar5;
        }
      }
      index = index + 1;
    } while (index < (this_00->
                     super_ReadOnlyList<EncodeRelocAndLabels,_Memory::ArenaAllocator,_DefaultComparer>
                     ).count);
  }
  if (finalCodeBufferStart + lVar6 < local_40) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x445,"(currentEndAddress >= currentStartAddress)",
                       "currentEndAddress >= currentStartAddress");
    if (!bVar2) goto LAB_0040feea;
    *puVar4 = 0;
  }
  local_34[0] = CalculateCRC(local_34[0],(long)(finalCodeBufferStart + lVar6) - (long)local_40,
                             local_40);
  EncoderMD::ApplyRelocs
            (this_01,(size_t)finalCodeBufferStart,finalCodeSize,local_34,
             isSuccessBrShortAndLoopAlign,true);
  if (local_34[0] == bufferCrcToValidate) {
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                     ,0x44e,"(false)","false");
  if (bVar2) {
    *puVar4 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_0040feea:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void Encoder::ValidateCRCOnFinalBuffer(_In_reads_bytes_(finalCodeSize) BYTE * finalCodeBufferStart, size_t finalCodeSize, size_t jumpTableSize, _In_reads_bytes_(finalCodeSize) BYTE * oldCodeBufferStart, uint initialCrcSeed, uint bufferCrcToValidate, BOOL isSuccessBrShortAndLoopAlign)
{
    RelocList * relocList = m_encoderMD.GetRelocList();

    BYTE * currentStartAddress = finalCodeBufferStart;
    BYTE * currentEndAddress = nullptr;
    size_t crcSizeToCompute = 0;

    size_t finalCodeSizeWithoutJumpTable = finalCodeSize - jumpTableSize;

    uint finalBufferCRC = initialCrcSeed;

    BYTE * oldPtr = nullptr;

    if (relocList != nullptr)
    {
        for (int index = 0; index < relocList->Count(); index++)
        {
            EncodeRelocAndLabels * relocTuple = &relocList->Item(index);

            //We will deal with the jump table and dictionary entries along with other reloc records in ApplyRelocs()
            if ((BYTE*)m_encoderMD.GetRelocBufferAddress(relocTuple) >= oldCodeBufferStart && (BYTE*)m_encoderMD.GetRelocBufferAddress(relocTuple) < (oldCodeBufferStart + finalCodeSizeWithoutJumpTable))
            {
                BYTE* finalBufferRelocTuplePtr = (BYTE*)m_encoderMD.GetRelocBufferAddress(relocTuple) - oldCodeBufferStart + finalCodeBufferStart;
                Assert(finalBufferRelocTuplePtr >= finalCodeBufferStart && finalBufferRelocTuplePtr < (finalCodeBufferStart + finalCodeSizeWithoutJumpTable));
                uint relocDataSize = m_encoderMD.GetRelocDataSize(relocTuple);
                if (relocDataSize != 0)
                {
                    AssertMsg(oldPtr == nullptr || oldPtr < finalBufferRelocTuplePtr, "Assumption here is that the reloc list is strictly increasing in terms of bufferAddress");
                    oldPtr = finalBufferRelocTuplePtr;

                    currentEndAddress = finalBufferRelocTuplePtr;
                    crcSizeToCompute = currentEndAddress - currentStartAddress;

                    Assert(currentEndAddress >= currentStartAddress);

                    finalBufferCRC = CalculateCRC(finalBufferCRC, crcSizeToCompute, currentStartAddress);
                    for (uint i = 0; i < relocDataSize; i++)
                    {
                        finalBufferCRC = CalculateCRC(finalBufferCRC, 0);
                    }
                    currentStartAddress = currentEndAddress + relocDataSize;
                }
            }
        }
    }

    currentEndAddress = finalCodeBufferStart + finalCodeSizeWithoutJumpTable;
    crcSizeToCompute = currentEndAddress - currentStartAddress;

    Assert(currentEndAddress >= currentStartAddress);

    finalBufferCRC = CalculateCRC(finalBufferCRC, crcSizeToCompute, currentStartAddress);

    //Include all offsets from the reloc records to the CRC.
    m_encoderMD.ApplyRelocs((size_t)finalCodeBufferStart, finalCodeSize, &finalBufferCRC, isSuccessBrShortAndLoopAlign, true);

    if (finalBufferCRC != bufferCrcToValidate)
    {
        Assert(false);
        Fatal();
    }
}